

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void deinterleave_data(float *in,float *out,int frames,int channels)

{
  ulong uVar1;
  ulong uVar2;
  float *pfVar3;
  
  if (0 < channels) {
    uVar2 = 0;
    do {
      if (0 < frames) {
        uVar1 = 0;
        pfVar3 = in;
        do {
          out[uVar1] = *pfVar3;
          uVar1 = uVar1 + 1;
          pfVar3 = pfVar3 + (uint)channels;
        } while ((uint)frames != uVar1);
      }
      uVar2 = uVar2 + 1;
      out = out + (uint)frames;
      in = in + 1;
    } while (uVar2 != (uint)channels);
  }
  return;
}

Assistant:

void
deinterleave_data (const float *in, float *out, int frames, int channels)
{	int fr, ch ;

	for (ch = 0 ; ch < channels ; ch++)
		for (fr = 0 ; fr < frames ; fr++)
			out [fr + frames * ch] = in [ch + channels * fr] ;

	return ;
}